

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::matroska_read_header(MatroskaDemuxer *this)

{
  Track *pTVar1;
  MatroskaTrack *track_00;
  int iVar2;
  uint32_t uVar3;
  ostream *poVar4;
  VodCoreException *pVVar5;
  ParsedH264TrackData *this_00;
  ParsedH265TrackData *this_01;
  ParsedH266TrackData *this_02;
  ParsedVC1TrackData *this_03;
  ParsedAC3TrackData *this_04;
  ParsedAACTrackData *this_05;
  ParsedLPCMTrackData *this_06;
  ParsedSRTTrackData *this_07;
  ParsedTrackPrivData *this_08;
  char *local_3b8;
  MatroskaTrack *track;
  int i_1;
  ostringstream local_360 [8];
  ostringstream ss_1;
  string local_1e0;
  ostringstream local_1b0 [8];
  ostringstream ss;
  uint32_t local_38;
  int local_34;
  uint32_t id;
  int res;
  int last_level;
  int version;
  char *doctype;
  MatroskaDemuxer *pMStack_18;
  int i;
  MatroskaDemuxer *this_local;
  
  pMStack_18 = this;
  for (doctype._4_4_ = 0; doctype._4_4_ < (this->super_IOContextDemuxer).num_tracks;
      doctype._4_4_ = doctype._4_4_ + 1) {
    pTVar1 = (this->super_IOContextDemuxer).tracks[doctype._4_4_];
    if (pTVar1 != (Track *)0x0) {
      operator_delete__(pTVar1);
    }
  }
  (this->super_IOContextDemuxer).num_tracks = 0;
  _last_level = (char *)0x0;
  local_34 = ebml_read_header(this,(char **)&last_level,&res);
  if (local_34 < 0) {
    return local_34;
  }
  if ((_last_level == (char *)0x0) || (iVar2 = strcmp(_last_level,"matroska"), iVar2 != 0)) {
    std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar4 = std::operator<<((ostream *)local_1b0,"Wrong EBML doctype (\'");
    if (_last_level == (char *)0x0) {
      local_3b8 = "(none)";
    }
    else {
      local_3b8 = _last_level;
    }
    poVar4 = std::operator<<(poVar4,local_3b8);
    std::operator<<(poVar4,"\' != \'matroska\').");
    pVVar5 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar5,900,&local_1e0);
    __cxa_throw(pVVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  if (2 < res) {
    std::__cxx11::ostringstream::ostringstream(local_360);
    poVar4 = std::operator<<((ostream *)local_360,
                             "Matroska demuxer version 2 too old for file version ");
    std::ostream::operator<<(poVar4,res);
    pVVar5 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(pVVar5,900,(string *)&i_1);
    __cxa_throw(pVVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  while( true ) {
    local_38 = ebml_peek_id(this,(int *)&id);
    if (local_38 == 0) {
      return -1;
    }
    if (local_38 == 0x18538067) break;
    local_34 = ebml_read_skip(this);
    if (local_34 < 0) {
      return local_34;
    }
  }
  local_34 = ebml_read_master(this,&local_38);
  if (local_34 < 0) {
    return local_34;
  }
  this->segment_start = (this->super_IOContextDemuxer).m_processedBytes;
  this->time_scale = 1000000;
  do {
    if (local_34 != 0) goto LAB_002c8210;
    local_38 = ebml_peek_id(this,&this->level_up);
    if (local_38 == 0) {
      local_34 = -1;
      goto LAB_002c8210;
    }
    if (this->level_up != 0) {
      this->level_up = this->level_up + -1;
      goto LAB_002c8210;
    }
    if ((local_38 == 0xbf) || (local_38 == 0xec)) {
      local_34 = ebml_read_skip(this);
    }
    else if (local_38 == 0x1043a770) {
      local_34 = ebml_read_master(this,&local_38);
      if (-1 < local_34) {
        local_34 = matroska_parse_chapters(this);
      }
    }
    else if (local_38 == 0x114d9b74) {
      ebml_read_skip(this);
    }
    else if (local_38 == 0x1254c367) {
      if ((this->metadata_parsed & 1U) == 0) {
        local_34 = ebml_read_master(this,&local_38);
        if (-1 < local_34) {
          local_34 = matroska_parse_metadata(this);
        }
      }
      else {
        local_34 = ebml_read_skip(this);
      }
    }
    else if (local_38 == 0x1549a966) {
      local_34 = ebml_read_master(this,&local_38);
      if (-1 < local_34) {
        local_34 = matroska_parse_info(this);
      }
    }
    else if (local_38 == 0x1654ae6b) {
      local_34 = ebml_read_master(this,&local_38);
      if (-1 < local_34) {
        local_34 = matroska_parse_tracks(this);
      }
    }
    else if (local_38 == 0x1c53bb6b) {
      if ((this->index_parsed & 1U) == 0) {
        local_34 = ebml_read_master(this,&local_38);
        if (-1 < local_34) {
          local_34 = matroska_parse_index(this);
        }
      }
      else {
        local_34 = ebml_read_skip(this);
      }
    }
    else if (local_38 == 0x1f43b675) {
      local_34 = 1;
    }
    else {
      local_34 = ebml_read_skip(this);
    }
  } while (this->level_up == 0);
  this->level_up = this->level_up + -1;
LAB_002c8210:
  uVar3 = ebml_peek_id(this,(int *)0x0);
  if (uVar3 == 0x1f43b675) {
    for (track._0_4_ = 0; (int)track < (this->super_IOContextDemuxer).num_tracks;
        track._0_4_ = (int)track + 1) {
      track_00 = (this->super_IOContextDemuxer).tracks[(int)track];
      track_00->stream_index = -1;
      if (track_00->codec_id != (char *)0x0) {
        iVar2 = this->num_streams;
        this->num_streams = iVar2 + 1;
        track_00->stream_index = iVar2;
        iVar2 = strcmp(track_00->codec_id,"V_MPEG4/ISO/AVC");
        if ((iVar2 == 0) && (track_00->codec_priv != (uchar *)0x0)) {
          this_00 = (ParsedH264TrackData *)operator_new(0x28);
          ParsedH264TrackData::ParsedH264TrackData
                    (this_00,track_00->codec_priv,track_00->codec_priv_size);
          track_00->parsed_priv_data = (ParsedTrackPrivData *)this_00;
        }
        else {
          iVar2 = strcmp(track_00->codec_id,"V_MPEGH/ISO/HEVC");
          if ((iVar2 == 0) && (track_00->codec_priv != (uchar *)0x0)) {
            this_01 = (ParsedH265TrackData *)operator_new(0x28);
            ParsedH265TrackData::ParsedH265TrackData
                      (this_01,track_00->codec_priv,track_00->codec_priv_size);
            track_00->parsed_priv_data = (ParsedTrackPrivData *)this_01;
          }
          else {
            iVar2 = strcmp(track_00->codec_id,"V_MPEGI/ISO/VVC");
            if ((iVar2 == 0) && (track_00->codec_priv != (uchar *)0x0)) {
              this_02 = (ParsedH266TrackData *)operator_new(0x28);
              ParsedH266TrackData::ParsedH266TrackData
                        (this_02,track_00->codec_priv,track_00->codec_priv_size);
              track_00->parsed_priv_data = (ParsedTrackPrivData *)this_02;
            }
            else {
              iVar2 = strcmp(track_00->codec_id,"V_MS/VFW/FOURCC");
              if ((iVar2 == 0) && (track_00->codec_priv != (uchar *)0x0)) {
                this_03 = (ParsedVC1TrackData *)operator_new(0x28);
                ParsedVC1TrackData::ParsedVC1TrackData
                          (this_03,track_00->codec_priv,track_00->codec_priv_size);
                track_00->parsed_priv_data = (ParsedTrackPrivData *)this_03;
              }
              else {
                iVar2 = strcmp(track_00->codec_id,"A_AC3");
                if (iVar2 == 0) {
                  this_04 = (ParsedAC3TrackData *)operator_new(0x10);
                  ParsedAC3TrackData::ParsedAC3TrackData
                            (this_04,track_00->codec_priv,track_00->codec_priv_size);
                  track_00->parsed_priv_data = (ParsedTrackPrivData *)this_04;
                }
                else {
                  iVar2 = strcmp(track_00->codec_id,"A_AAC");
                  if (iVar2 == 0) {
                    this_05 = (ParsedAACTrackData *)operator_new(0x28);
                    ParsedAACTrackData::ParsedAACTrackData
                              (this_05,track_00->codec_priv,track_00->codec_priv_size);
                    track_00->parsed_priv_data = (ParsedTrackPrivData *)this_05;
                  }
                  else {
                    iVar2 = strcmp(track_00->codec_id,"A_PCM/INT/BIG");
                    if (((iVar2 == 0) ||
                        (iVar2 = strcmp(track_00->codec_id,"A_PCM/INT/LIT"), iVar2 == 0)) ||
                       (iVar2 = strcmp(track_00->codec_id,"A_MS/ACM"), iVar2 == 0)) {
                      this_06 = (ParsedLPCMTrackData *)operator_new(0x30);
                      ParsedLPCMTrackData::ParsedLPCMTrackData(this_06,track_00);
                      track_00->parsed_priv_data = (ParsedTrackPrivData *)this_06;
                    }
                    else {
                      iVar2 = strcmp(track_00->codec_id,"S_TEXT/UTF8");
                      if (iVar2 == 0) {
                        this_07 = (ParsedSRTTrackData *)operator_new(0x10);
                        ParsedSRTTrackData::ParsedSRTTrackData
                                  (this_07,track_00->codec_priv,track_00->codec_priv_size);
                        track_00->parsed_priv_data = (ParsedTrackPrivData *)this_07;
                      }
                      else {
                        iVar2 = strcmp(track_00->codec_id,"S_HDMV/PGS");
                        if (iVar2 == 0) {
                          this_08 = (ParsedTrackPrivData *)operator_new(8);
                          memset(this_08,0,8);
                          ParsedPGTrackData::ParsedPGTrackData((ParsedPGTrackData *)this_08);
                          track_00->parsed_priv_data = this_08;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    local_34 = 0;
  }
  return local_34;
}

Assistant:

int MatroskaDemuxer::matroska_read_header()
{
    for (int i = 0; i < num_tracks; i++) delete[] reinterpret_cast<char *>(tracks[i]);
    num_tracks = 0;

    // MatroskaDemuxContext *matroska = s->priv_data;
    char *doctype = nullptr;
    int version, last_level, res;
    uint32_t id;

    // matroska->ctx = s;

    /* First read the EBML header. */
    if ((res = ebml_read_header(&doctype, &version)) < 0)
        return res;
    if ((doctype == nullptr) || strcmp(doctype, "matroska") != 0)
    {
        THROW(ERR_MATROSKA_PARSE, "Wrong EBML doctype ('" << (doctype ? doctype : "(none)") << "' != 'matroska').")
    }
    if (version > 2)
    {
        THROW(ERR_MATROSKA_PARSE, "Matroska demuxer version 2 too old for file version " << version)
    }

    /* The next thing is a segment. */
    while (true)
    {
        if ((id = ebml_peek_id(&last_level)) == 0)
            return -BufferedReader::DATA_EOF;
        if (id == MATROSKA_ID_SEGMENT)
            break;
        if ((res = ebml_read_skip()) < 0)
            return res;
    }

    /* We now have a Matroska segment.
     * Seeks are from the beginning of the segment,
     * after the segment ID/length. */
    if ((res = ebml_read_master(&id)) < 0)
        return res;
    segment_start = m_processedBytes;

    time_scale = 1000000;
    /* we've found our segment, start reading the different contents in here */
    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            res = -BufferedReader::DATA_EOF;
            break;
        }
        if (level_up)
        {
            level_up--;
            break;
        }

        switch (id)
        {
        /* stream info */
        case MATROSKA_ID_INFO:
        {
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_info();
            break;
        }

        /* track info headers */
        case MATROSKA_ID_TRACKS:
        {
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_tracks();
            break;
        }

        case MATROSKA_ID_CHAPTERS:
            if ((res = ebml_read_master(&id)) < 0)
                break;
            res = matroska_parse_chapters();
            break;

        /* stream index */
        case MATROSKA_ID_CUES:
        {
            if (!index_parsed)
            {
                if ((res = ebml_read_master(&id)) < 0)
                    break;
                res = matroska_parse_index();
            }
            else
                res = ebml_read_skip();
            break;
        }

        /* metadata */
        case MATROSKA_ID_TAGS:
        {
            if (!metadata_parsed)
            {
                if ((res = ebml_read_master(&id)) < 0)
                    break;
                res = matroska_parse_metadata();
            }
            else
                res = ebml_read_skip();
            break;
        }

        /* file index (if seekable, seek to Cues/Tags to parse it) */
        case MATROSKA_ID_SEEKHEAD:
        {
            ebml_read_skip();
            break;
        }

        case MATROSKA_ID_CLUSTER:
        {
            /* Do not read the master - this will be done in the next
             * call to matroska_read_packet. */
            res = 1;
            break;
        }

        case EBML_ID_VOID:
        case EBML_ID_CRC32:
            res = ebml_read_skip();
            break;

        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown matroska file header ID " << id);
        }

        if (level_up)
        {
            level_up--;
            break;
        }
    }

    /* Have we found a cluster? */
    if (ebml_peek_id(nullptr) == MATROSKA_ID_CLUSTER)
    {
        for (int i = 0; i < num_tracks; i++)
        {
            MatroskaTrack *track = tracks[i];
            track->stream_index = -1;
            if (track->codec_id == nullptr)
                continue;

            track->stream_index = num_streams++;

            if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AVC_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedH264TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_HEVC_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedH265TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_VVC_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedH266TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_VIDEO_VFW_FOURCC) && (track->codec_priv != nullptr))
            {
                track->parsed_priv_data = new ParsedVC1TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_AC3))
            {
                track->parsed_priv_data = new ParsedAC3TrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_AAC))
            {
                track->parsed_priv_data = new ParsedAACTrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_PCM_BIG) ||
                     !strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_PCM_LIT) ||
                     !strcmp(track->codec_id, MATROSKA_CODEC_ID_AUDIO_ACM))
            {
                track->parsed_priv_data = new ParsedLPCMTrackData(track);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_SRT))
            {
                track->parsed_priv_data = new ParsedSRTTrackData(track->codec_priv, track->codec_priv_size);
            }
            else if (!strcmp(track->codec_id, MATROSKA_CODEC_ID_SUBTITLE_PGS))
            {
                track->parsed_priv_data = new ParsedPGTrackData();
            }
        }
        res = 0;
    }

    return res;
}